

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O2

void __thiscall
CS248::Camera::configure(Camera *this,CameraInfo *info,size_t screenW,size_t screenH)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Camera *pCVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  
  this->screenW = screenW;
  this->screenH = screenH;
  uVar1 = info->nClip;
  uVar3 = info->fClip;
  this->nClip = (double)(float)uVar1;
  this->fClip = (double)(float)uVar3;
  uVar2 = info->hFov;
  uVar4 = info->vFov;
  this->hFov = (double)(float)uVar2;
  this->vFov = (double)(float)uVar4;
  dVar6 = tan((double)(float)uVar2 * 0.017453292519943295 * 0.5);
  dVar7 = tan(this->vFov * 0.017453292519943295 * 0.5);
  auVar8._8_4_ = (int)(screenW >> 0x20);
  auVar8._0_8_ = screenW;
  auVar8._12_4_ = 0x45300000;
  auVar9._8_4_ = (int)(screenH >> 0x20);
  auVar9._0_8_ = screenH;
  auVar9._12_4_ = 0x45300000;
  dVar12 = (auVar9._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)screenH) - 4503599627370496.0);
  auVar10._8_8_ =
       (auVar8._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)screenW) - 4503599627370496.0);
  auVar10._0_8_ = dVar6;
  auVar11._8_8_ = dVar12;
  auVar11._0_8_ = dVar7;
  auVar11 = divpd(auVar10,auVar11);
  dVar6 = auVar11._8_8_;
  this->ar = dVar6;
  if (dVar6 <= auVar11._0_8_) {
    if (auVar11._0_8_ <= dVar6) goto LAB_0016bdcb;
    pCVar5 = (Camera *)&this->vFov;
    dVar6 = tan(this->hFov * 0.017453292519943295 * 0.5);
    dVar6 = dVar6 / this->ar;
  }
  else {
    dVar6 = tan(this->vFov * 0.017453292519943295 * 0.5);
    dVar6 = dVar6 * this->ar;
    pCVar5 = this;
  }
  dVar6 = atan(dVar6);
  pCVar5->hFov = dVar6 * 57.29577951308232 + dVar6 * 57.29577951308232;
LAB_0016bdcb:
  dVar6 = tan(this->vFov * 0.017453292519943295 * 0.5);
  this->screenDist = dVar12 / (dVar6 + dVar6);
  return;
}

Assistant:

void Camera::configure(const CameraInfo& info, size_t screenW, size_t screenH) {
    this->screenW = screenW;
    this->screenH = screenH;
    nClip = info.nClip;
    fClip = info.fClip;
    hFov = info.hFov;
    vFov = info.vFov;
  //  targetPos = info.view_dir;
  //  acos(c_dir.y), atan2(c_dir.x, c_dir.z)

    double ar1 = tan(radians(hFov) / 2) / tan(radians(vFov) / 2);
    ar = static_cast<double>(screenW) / screenH;
    if (ar1 < ar) {
        // hFov is too small
        hFov = 2 * degrees(atan(tan(radians(vFov) / 2) * ar));
    } else if (ar1 > ar) {
        // vFov is too small
        vFov = 2 * degrees(atan(tan(radians(hFov) / 2) / ar));
    }
    screenDist = ((double)screenH) / (2.0 * tan(radians(vFov) / 2));
}